

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O3

double HTS_Label_get_end_frame(HTS_Label *label,size_t index)

{
  size_t i;
  
  i = 0;
  do {
    label = (HTS_Label *)((HTS_LabelString *)label)->next;
    if (index <= i) break;
    i = i + 1;
  } while ((HTS_LabelString *)label != (HTS_LabelString *)0x0);
  if ((HTS_LabelString *)label != (HTS_LabelString *)0x0) {
    return ((HTS_LabelString *)label)->end;
  }
  return -1.0;
}

Assistant:

double HTS_Label_get_end_frame(HTS_Label * label, size_t index)
{
   size_t i;
   HTS_LabelString *lstring = label->head;

   for (i = 0; i < index && lstring; i++)
      lstring = lstring->next;
   if (!lstring)
      return -1.0;
   return lstring->end;
}